

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall test_solvers_3x3::test_method(test_solvers_3x3 *this)

{
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> _Stack_98;
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  local_80;
  size_t expected_assignment [3];
  int costs [9];
  
  costs[4] = 2;
  costs[5] = -1;
  costs[6] = 3;
  costs[7] = 0;
  costs[0] = 1;
  costs[1] = 2;
  costs[2] = 4;
  costs[3] = 0;
  costs[8] = -3;
  expected_assignment[0] = 1;
  expected_assignment[1] = 0;
  expected_assignment[2] = 2;
  make_matrix<int>(&local_80,costs,3,3);
  make_vector<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_98,expected_assignment
             ,3);
  assert_solvers_result<int>
            (&local_80,-1,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_98);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&_Stack_98);
  boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>::~unbounded_array
            (&local_80.data_);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_solvers_3x3)
{
  const int costs[] = {1, 2, 4,
                       0, 2, -1,
                       3, 0, -3};
  const std::size_t expected_assignment[] = {1, 0, 2};
  assert_solvers_result(make_matrix(costs, 3, 3), -1, make_vector(expected_assignment, 3));
}